

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_choice.cpp
# Opt level: O2

void Am_Choice_Set_Value(Am_Object *inter,bool set_selected)

{
  Am_Value_Type type;
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  ostream *poVar4;
  Am_Value_List *pAVar5;
  Am_Object *pAVar6;
  Am_Object old_value_obj;
  Am_Object new_value;
  Am_Value_List old_value_list;
  Am_Value old_value;
  Am_Choice_How_Set how_set;
  
  pAVar6 = &old_value_obj;
  pAVar2 = Am_Object::Get(inter,0x16a,0);
  Am_Object::Am_Object(&new_value,pAVar2);
  pAVar2 = Am_Object::Get(inter,0xd4,0);
  Am_Choice_How_Set::Am_Choice_How_Set(&how_set,pAVar2);
  old_value.type = 0;
  old_value.value.wrapper_value = (Am_Wrapper *)0x0;
  old_value_obj.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&old_value_list);
  pAVar2 = Am_Object::Get(inter,0x169,1);
  Am_Value::operator=(&old_value,pAVar2);
  type = old_value.type;
  bVar1 = Am_Value::Valid(&old_value);
  pAVar5 = &old_value_list;
  if (bVar1) {
    if (type != 0xa001) {
      bVar1 = Am_Value_List::Test(&old_value);
      if (!bVar1) {
        std::operator<<((ostream *)&std::cerr,"** Amulet Error: Bad type ");
        Am_Print_Type((ostream *)&std::cerr,type);
        poVar4 = std::operator<<((ostream *)&std::cerr," in VALUE of inter ");
        poVar4 = operator<<(poVar4,inter);
        poVar4 = std::operator<<(poVar4," = ");
        poVar4 = operator<<(poVar4,&old_value);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::ostream::flush();
        goto LAB_001bdad2;
      }
      Am_Value_List::operator=(&old_value_list,&old_value);
      goto LAB_001bd66f;
    }
    Am_Object::operator=(&old_value_obj,&old_value);
LAB_001bd5e9:
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&old_value_obj);
    Am_Object::Set(inter,0x16c,pAVar3,1);
    if (how_set.value == Am_CHOICE_LIST_TOGGLE.value) {
      bVar1 = Am_Object::operator==(&old_value_obj,&new_value);
      if (!bVar1) {
        bVar1 = Am_Object::Valid(&old_value_obj);
        if (bVar1) {
          pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&old_value_obj);
          Am_Value_List::Add(&old_value_list,pAVar3,Am_TAIL,true);
        }
        bVar1 = Am_Object::Valid(&new_value);
        if (!bVar1) goto LAB_001bd9ad;
        pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&new_value);
        Am_Value_List::Add(&old_value_list,pAVar3,Am_TAIL,true);
        goto LAB_001bd990;
      }
      if ((!set_selected) || (bVar1 = Am_Object::Valid(&old_value_obj), !bVar1)) goto LAB_001bd9ad;
      bVar1 = false;
LAB_001bd997:
      Am_Object::Set(pAVar6,0x172,bVar1,1);
      pAVar5 = &old_value_list;
      goto LAB_001bd9ad;
    }
    if (how_set.value == Am_CHOICE_SET.value) {
      pAVar6 = &new_value;
      if (set_selected) {
        bVar1 = Am_Object::Valid(&old_value_obj);
        if (bVar1) {
          Am_Object::Set(&old_value_obj,0x172,false,1);
        }
        bVar1 = Am_Object::Valid(&new_value);
LAB_001bd761:
        pAVar6 = &new_value;
        if (bVar1 != false) {
          Am_Object::Set(&new_value,0x172,true,1);
          pAVar6 = &new_value;
        }
      }
    }
    else if (how_set.value == Am_CHOICE_CLEAR.value) {
      pAVar6 = &Am_No_Object;
      if (set_selected) {
        bVar1 = Am_Object::Valid(&old_value_obj);
LAB_001bd89d:
        pAVar6 = &Am_No_Object;
        if (bVar1 != false) {
          Am_Object::Set(&old_value_obj,0x172,false,1);
          pAVar6 = &Am_No_Object;
        }
      }
    }
    else {
      if (how_set.value != Am_CHOICE_TOGGLE.value) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"** Amulet Error: Illegal how_set ");
        poVar4 = operator<<(poVar4,&how_set);
        std::endl<char,std::char_traits<char>>(poVar4);
LAB_001bdad2:
        Am_Error();
      }
      bVar1 = Am_Object::operator==(&old_value_obj,&new_value);
      if (bVar1) {
        pAVar6 = &Am_No_Object;
        if (set_selected) {
          bVar1 = Am_Object::Valid(&old_value_obj);
          goto LAB_001bd89d;
        }
      }
      else {
        pAVar6 = &new_value;
        if (set_selected) {
          bVar1 = Am_Object::Valid(&old_value_obj);
          if (bVar1) {
            Am_Object::Set(&old_value_obj,0x172,false,1);
          }
          bVar1 = Am_Object::Valid(&new_value);
          goto LAB_001bd761;
        }
      }
    }
LAB_001bd9ec:
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  }
  else {
    if (type == 0xa001) goto LAB_001bd5e9;
LAB_001bd66f:
    pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&old_value_list);
    Am_Object::Set(inter,0x16c,pAVar3,1);
    if (how_set.value != Am_CHOICE_LIST_TOGGLE.value) {
      Am_Value_List::Start(&old_value_list);
      bVar1 = Am_Object::Valid(&new_value);
      if (bVar1) {
        if (how_set.value == Am_CHOICE_CLEAR.value) {
LAB_001bd7b5:
          Am_Object::operator=(&new_value,&Am_No_Object);
        }
        else {
          if (how_set.value == Am_CHOICE_LIST_TOGGLE.value) {
            pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&new_value);
            bVar1 = Am_Value_List::Member(&old_value_list,pAVar3);
            if (bVar1) goto LAB_001bd7b5;
          }
          if (set_selected) {
            Am_Object::Set(&new_value,0x172,true,1);
          }
        }
      }
      Am_Value_List::Start(&old_value_list);
      while (bVar1 = Am_Value_List::Last(&old_value_list), pAVar6 = &new_value, !bVar1) {
        pAVar2 = Am_Value_List::Get(&old_value_list);
        Am_Object::operator=(&old_value_obj,pAVar2);
        if ((set_selected) && (bVar1 = Am_Object::operator!=(&old_value_obj,&new_value), bVar1)) {
          Am_Object::Set(&old_value_obj,0x172,false,1);
        }
        Am_Value_List::Next(&old_value_list);
      }
      goto LAB_001bd9ec;
    }
    Am_Value_List::Start(&old_value_list);
    bVar1 = Am_Object::Valid(&new_value);
    if (!bVar1) goto LAB_001bda06;
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&new_value);
    bVar1 = Am_Value_List::Member(&old_value_list,pAVar3);
    if (bVar1) {
      if (set_selected) {
        Am_Object::Set(&new_value,0x172,false,1);
      }
      Am_Value_List::Delete(&old_value_list,true);
      bVar1 = Am_Value_List::Empty(&old_value_list);
      pAVar5 = &old_value_list;
      if (bVar1) {
        pAVar5 = &Am_No_Value_List;
      }
    }
    else {
      pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&new_value);
      Am_Value_List::Add(&old_value_list,pAVar3,Am_TAIL,true);
LAB_001bd990:
      pAVar6 = &new_value;
      bVar1 = true;
      pAVar5 = &old_value_list;
      if (set_selected) goto LAB_001bd997;
    }
LAB_001bd9ad:
    pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar5);
  }
  Am_Object::Set(inter,0x169,pAVar3,0);
LAB_001bda06:
  Am_Value_List::~Am_Value_List(&old_value_list);
  Am_Object::~Am_Object(&old_value_obj);
  Am_Value::~Am_Value(&old_value);
  Am_Object::~Am_Object(&new_value);
  return;
}

Assistant:

void
Am_Choice_Set_Value(Am_Object inter, bool set_selected)
{
  Am_Object new_value = inter.Get(Am_INTERIM_VALUE);
  Am_Choice_How_Set how_set = inter.Get(Am_HOW_SET);

  // now set real value

  // first check if slot contains correct type: single object or list
  Am_Value old_value;
  Am_Object old_value_obj;
  Am_Value_List old_value_list;
  old_value = inter.Peek(Am_VALUE);
  Am_Value_Type old_value_type = old_value.type;
  // if not valid, old_value_obj and old_value_list already are not valid
  if (old_value.Valid()) {
    if (old_value_type == Am_OBJECT)
      old_value_obj = old_value;
    else if (Am_Value_List::Test(old_value))
      old_value_list = old_value;
    else {
      std::cerr << "** Amulet Error: Bad type ";
      Am_Print_Type(std::cerr, old_value_type);
      std::cerr << " in VALUE of inter " << inter << " = " << old_value
                << std::endl
                << std::flush;
      Am_Error();
    }
  }

  //save current value as old in case needed for undo
  if (old_value_type == Am_OBJECT)
    inter.Set(Am_OLD_VALUE, old_value_obj, Am_OK_IF_NOT_THERE);
  else
    inter.Set(Am_OLD_VALUE, old_value_list, Am_OK_IF_NOT_THERE);

  if (how_set == Am_CHOICE_LIST_TOGGLE) {
    if (old_value_type == Am_OBJECT) {
      // used to be a single value, might become a list
      if (old_value_obj == new_value) {
        if (set_selected && old_value_obj.Valid()) {
          Am_REPORT_SET_SEL_VALUE(true, inter, old_value_obj, false);
          old_value_obj.Set(Am_SELECTED, false,
                            Am_OK_IF_NOT_THERE); // and leave new list empty
        }
      } else { // old value is a list
        // put them both in the new list
        if (old_value_obj.Valid())
          old_value_list.Add(old_value_obj);
        if (new_value.Valid()) {
          old_value_list.Add(new_value);
          if (set_selected) {
            Am_REPORT_SET_SEL_VALUE(true, inter, new_value, true);
            new_value.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
          }
        }
      }
      //put new list into slot.
      inter.Set(Am_VALUE, old_value_list);
    } else {
      // originally a list, will stay a list or get cleared
      old_value_list.Start(); // initialize list for Member or for loop
      if (!new_value.Valid()) {
      } /*  Don't do anything *********
	       // { // clear out list
	       // // clear all the SELECTED slots of the individual objects
	       // for ( ; !old_value_list.Last (); old_value_list.Next ()) {
	       // old_value_obj = old_value_list.Get ();
	       // Am_REPORT_SET_SEL_VALUE (true, inter, old_value_obj, false);
	       // old_value_obj.Set (Am_SELECTED, false);
	       // }
	       // // forget about the list; just make it an empty object.
	       // inter.Set (Am_VALUE, new_value);
	       // } // end of if (!new_value)
      */
      // old_value_list exists, new_value exists
      else if (old_value_list.Member(new_value)) {
        if (set_selected) {
          Am_REPORT_SET_SEL_VALUE(true, inter, new_value, false);
          new_value.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
        }
        old_value_list.Delete();
        if (old_value_list.Empty())
          // no objects left in list, so don't store empty list
          inter.Set(Am_VALUE, Am_No_Value_List);
        else
          inter.Set(Am_VALUE, old_value_list);
      } else { // add it at end
        old_value_list.Add(new_value);
        if (set_selected) {
          Am_REPORT_SET_SEL_VALUE(true, inter, new_value, true);
          new_value.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
        }
        inter.Set(Am_VALUE, old_value_list);
      }
    }
  }      // end of how_set == List toggle
  else { // single value
    if (old_value_type == Am_OBJECT) {
      // single new value, single old value
      if (how_set == Am_CHOICE_SET) {
        if (set_selected && old_value_obj.Valid()) {
          Am_REPORT_SET_SEL_VALUE(true, inter, old_value_obj, false);
          old_value_obj.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
        }
        if (set_selected && new_value.Valid()) {
          Am_REPORT_SET_SEL_VALUE(true, inter, new_value, true);
          new_value.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
        }
        inter.Set(Am_VALUE, new_value); // put new value into slot
      } else if (how_set == Am_CHOICE_CLEAR) {
        if (set_selected && old_value_obj.Valid()) {
          Am_REPORT_SET_SEL_VALUE(true, inter, old_value_obj, false);
          old_value_obj.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
        }
        inter.Set(Am_VALUE, Am_No_Object); // empty
      } else if (how_set == Am_CHOICE_TOGGLE) {
        if (old_value_obj == new_value) {
          if (set_selected && old_value_obj.Valid()) {
            Am_REPORT_SET_SEL_VALUE(true, inter, old_value_obj, false);
            old_value_obj.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
          }
          inter.Set(Am_VALUE, Am_No_Object); // empty
        } else {                             // set with new value
          if (set_selected && old_value_obj.Valid()) {
            Am_REPORT_SET_SEL_VALUE(true, inter, old_value_obj, false);
            old_value_obj.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
          }
          if (set_selected && new_value.Valid()) {
            Am_REPORT_SET_SEL_VALUE(true, inter, new_value, true);
            new_value.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
          }
          inter.Set(Am_VALUE, new_value); // put new value into slot
        }
      } else {
        std::cerr << "** Amulet Error: Illegal how_set " << how_set
                  << std::endl;
        Am_Error();
      }
    } else {
      // used to be multiple values, now is just one
      old_value_list.Start(); // set pointer back to the beginning
      // see if new object should NOT be in the set
      if (new_value.Valid()) {
        if ((how_set == Am_CHOICE_CLEAR) || (how_set == Am_CHOICE_LIST_TOGGLE &&
                                             old_value_list.Member(new_value)))
          new_value = Am_No_Object;
        else {
          if (set_selected) {
            // item must be selected if not previously in list or being cleared
            Am_REPORT_SET_SEL_VALUE(true, inter, new_value, true);
            new_value.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
          }
        }
      }
      for (old_value_list.Start(); !old_value_list.Last();
           old_value_list.Next()) {
        old_value_obj = old_value_list.Get();
        if (set_selected && old_value_obj != new_value) {
          Am_REPORT_SET_SEL_VALUE(true, inter, old_value_obj, false);
          //clear all the other values
          old_value_obj.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
        }
      }
      //put new value into slot. Will automatically deallocate old_value_list
      inter.Set(Am_VALUE, new_value);
    } // else single old value
  }   // else single new value
}